

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O2

string * __thiscall
Json::JsonParser::parseNumber_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  JsonReader *this_00;
  int iVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  byte value;
  uint uVar6;
  ulong uVar7;
  JsonException *this_01;
  int iVar8;
  JsonParser *this_02;
  double d;
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  bVar4 = false;
  bVar3 = false;
  if (prev != '+') {
    if (prev == '-') {
      bVar4 = true;
    }
    else {
      if (prev == '.') {
        std::__cxx11::string::append((char *)this);
        bVar3 = true;
        bVar4 = false;
        goto LAB_001080d0;
      }
      buffer_append(this,prev);
      bVar4 = false;
    }
    bVar3 = false;
  }
LAB_001080d0:
  this_00 = &this->__reader;
  cVar5 = JsonReader::get(this_00);
  if (bVar3) {
LAB_001080eb:
    iVar8 = (this->__reader).__ptr;
    if (0 < iVar8) {
      (this->__reader).__ptr = iVar8 + -1;
    }
  }
  else if (cVar5 == '.') {
    if (9 < (byte)(prev - 0x30U)) {
      buffer_append(this,'0');
    }
    buffer_append(this,'.');
    bVar3 = true;
  }
  else {
    sVar2 = (this->__buffer_value)._M_string_length;
    if (((sVar2 != 0) && ((byte)(cVar5 - 0x30U) < 10)) &&
       ((this->__buffer_value)._M_dataplus._M_p[sVar2 - 1] == '0')) {
      iVar8 = (this->__reader).__ptr;
      if (0 < iVar8) {
        (this->__reader).__ptr = iVar8 + -1;
      }
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
      goto LAB_001083bd;
    }
    if (((cVar5 == '-' && (byte)(prev ^ 0x2bU) == 0) || ((byte)(prev ^ 0x2bU) == 0 && cVar5 == '+'))
       || ((prev == '-' && ((cVar5 - 0x2bU & 0xfd) == 0)))) {
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
      goto LAB_001083bd;
    }
    if (9 < (byte)(cVar5 - 0x30U)) goto LAB_001080eb;
    buffer_append(this,cVar5);
  }
LAB_001081a4:
  do {
    value = JsonReader::get(this_00);
    uVar7 = (ulong)value;
    if (value < 0x21) {
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_001081a4;
    }
    if ((byte)(value - 0x30) < 10) {
      if (((1 < (int)(this->__buffer_value)._M_string_length) &&
          (cVar5 = buffer_index(this,0), cVar5 == '0')) &&
         (cVar5 = buffer_index(this,1), (byte)(cVar5 - 0x30U) < 10)) {
        iVar1 = (this->__reader).__len;
        uVar6 = (this->__reader).__ptr - (int)(this->__buffer_value)._M_string_length;
        iVar8 = uVar6 + 1;
        if (iVar8 < iVar1) {
          iVar1 = iVar8;
        }
        iVar8 = 0;
        if (uVar6 < 0x7fffffff) {
          iVar8 = iVar1;
        }
        (this->__reader).__ptr = iVar8;
        this_01 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_01,this_00);
        goto LAB_001083bd;
      }
LAB_00108265:
      buffer_append(this,value);
      goto LAB_001081a4;
    }
    if (value == 0x2e) {
      if (!bVar3) {
        bVar3 = true;
        value = 0x2e;
        goto LAB_00108265;
      }
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
      goto LAB_001083bd;
    }
    if ((value == 0x65) || (value == 0x45)) {
      sVar2 = (this->__buffer_value)._M_string_length;
      if ((sVar2 == 0) || ((this->__buffer_value)._M_dataplus._M_p[sVar2 - 1] != '.')) {
        buffer_append(this,value);
        value = JsonReader::get(this_00);
        if ((((byte)(value - 0x30) < 10) || (value == 0x2b)) || (value == 0x2d)) goto LAB_00108265;
        this_01 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_01,this_00);
      }
      else {
        iVar8 = (this->__reader).__ptr;
        if (0 < iVar8) {
          (this->__reader).__ptr = iVar8 + -1;
        }
        this_01 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_01,this_00);
      }
      goto LAB_001083bd;
    }
    sVar2 = (this->__buffer_value)._M_string_length;
    if ((sVar2 != 0) && ((this->__buffer_value)._M_dataplus._M_p[sVar2 - 1] == '.')) {
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
      goto LAB_001083bd;
    }
    if (0x2c < value) goto LAB_001082a3;
  } while ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0);
  if (uVar7 != 0x2c) {
LAB_001082a3:
    if ((value != 0x5d) && (value != 0x7d)) {
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
LAB_001083bd:
      __cxa_throw(this_01,&JsonException::typeinfo,JsonException::~JsonException);
    }
  }
  iVar8 = (this->__reader).__ptr;
  if (0 < iVar8) {
    (this->__reader).__ptr = iVar8 + -1;
  }
  if (bVar4) {
    buffer_insert(this,'-',0);
  }
  this_02 = (JsonParser *)0x0;
  d = strtod((this->__buffer_value)._M_dataplus._M_p,(char **)0x0);
  __num2str_abi_cxx11_(__return_storage_ptr__,this_02,d);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::parseNumber(char prev) {
    buffer_reset();
    bool __unique = false, __negative = false;
    // -.1234 => -0.1234, .1234 => 0.1234
    if (prev == '+');
    else if (prev == '-')__negative = true;
    else if (prev == '.') {
        buffer_append("0.");
        __unique = true;
    } else buffer_append(prev);

    char c = __reader.get();
    if (!__unique) {  // +., -., 1.
        if (c == '.') {
            if (!is_number(prev)) buffer_append('0');
            buffer_append(c);
            __unique = true;
        } else if (buffer_back() == '0' && is_number(c)) {
            __reader.back();
            throw JsonException(__reader);
        } else if ((prev == '+' && c == '-') || (prev == '+' && c == '+')
                   || (prev == '-' && c == '-') || (prev == '-' && c == '+'))
            throw JsonException(__reader);
        else if (is_number(c))buffer_append(c);
        else __reader.back();
    } else __reader.back();

    for (;;) {
        char c = __reader.get();

        if (is_space_char(c)) continue;

        if (is_number(c) || c == '.' || c == 'e' || c == 'E') {
            // 1e+2, 1e-2, -1e2, .1e+2, 0.1e+2, -.1e+2, -e+2, -0e+2, .0e-3
            if (c == 'e' || c == 'E') {
                if (buffer_back() == '.') { // .E-3
                    __reader.back();
                    throw JsonException(__reader);
                }
                buffer_append(c);
                c = __reader.get();
                if (!(is_number(c) || c == '+' || c == '-')) throw JsonException(__reader);
                buffer_append(c);
            } else if (c == '.') {
                if (__unique) throw JsonException(__reader);
                buffer_append(c);
                __unique = true;
            } else {
                if (buffer_size() >= 2) {
                    if (buffer_index() == '0' && is_number(buffer_index(1))) {
                        __reader.moveTo(-(buffer_size() - 1));
                        throw JsonException(__reader);
                    }
                }
                buffer_append(c);
            }
        } else {
            if (buffer_back() == '.') throw JsonException(__reader);
            if (c == JSON_SEPARATE || c == JSON_OBJECT_END || c == JSON_ARRAY_END)break;
            if (is_space_char(c))continue;
            else throw JsonException(__reader);
        }
    }
    __reader.back();
    if (__negative)
        buffer_insert('-');
    return __num2str(strtod((buffer_str()), nullptr));
}